

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O1

int mriStep_SetDeltaGammaMax(ARKodeMem ark_mem,sunrealtype dgmax)

{
  int iVar1;
  ARKodeMRIStepMem step_mem;
  ARKodeMRIStepMem local_20;
  double local_18;
  
  local_18 = dgmax;
  iVar1 = mriStep_AccessStepMem(ark_mem,"mriStep_SetDeltaGammaMax",&local_20);
  if (iVar1 == 0) {
    local_20->dgmax =
         (sunrealtype)
         (~-(ulong)(0.0 < local_18) & 0x3fc999999999999a |
         (ulong)local_18 & -(ulong)(0.0 < local_18));
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mriStep_SetDeltaGammaMax(ARKodeMem ark_mem, sunrealtype dgmax)
{
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* if argument legal set it, otherwise set default */
  if (dgmax <= ZERO) { step_mem->dgmax = DGMAX; }
  else { step_mem->dgmax = dgmax; }

  return (ARK_SUCCESS);
}